

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

Module * __thiscall soul::Program::addGraph(Program *this,int index)

{
  ProgramImpl *this_00;
  Module *pMVar1;
  int index_local;
  Program *this_local;
  
  this_00 = this->pimpl;
  pMVar1 = Module::createGraph(this);
  pMVar1 = ProgramImpl::insert(this_00,index,pMVar1);
  return pMVar1;
}

Assistant:

Module& Program::addGraph (int index)                                                   { return pimpl->insert (index, Module::createGraph     (*this)); }